

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMRangeImpl::DOMRangeImpl(DOMRangeImpl *this,DOMRangeImpl *other)

{
  DOMRangeImpl *other_local;
  DOMRangeImpl *this_local;
  
  DOMRange::DOMRange(&this->super_DOMRange,&other->super_DOMRange);
  (this->super_DOMRange)._vptr_DOMRange = (_func_int **)&PTR__DOMRangeImpl_0052c028;
  this->fStartContainer = other->fStartContainer;
  this->fStartOffset = other->fStartOffset;
  this->fEndContainer = other->fEndContainer;
  this->fEndOffset = other->fEndOffset;
  this->fCollapsed = (bool)(other->fCollapsed & 1);
  this->fDocument = other->fDocument;
  this->fDetached = (bool)(other->fDetached & 1);
  this->fRemoveChild = other->fRemoveChild;
  this->fMemoryManager = other->fMemoryManager;
  return;
}

Assistant:

DOMRangeImpl::DOMRangeImpl(const DOMRangeImpl& other)
:   DOMRange(other),
    fStartContainer(other.fStartContainer),
    fStartOffset(other.fStartOffset),
    fEndContainer(other.fEndContainer),
    fEndOffset(other.fEndOffset),
    fCollapsed(other.fCollapsed),
    fDocument(other.fDocument),
    fDetached(other.fDetached),
    fRemoveChild(other.fRemoveChild),
    fMemoryManager(other.fMemoryManager)
{
}